

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O3

void __thiscall EditorInterface::showSaveDialog(EditorInterface *this,function<void_()> *action)

{
  element_type *peVar1;
  String *pSVar2;
  undefined8 uVar3;
  EditorInterface *pEVar4;
  size_type sVar5;
  _Link_type p_Var6;
  undefined8 *puVar7;
  Vector2f *pVVar8;
  bool recursive;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  float x;
  float y;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar9;
  shared_ptr<gui::Button> saveRefuseButton;
  shared_ptr<gui::Button> saveSubmitButton;
  shared_ptr<gui::DialogBox> saveDialog;
  undefined1 local_a8 [32];
  code *local_88;
  String *local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  EditorInterface *local_40;
  locale local_38 [8];
  
  ::gui::Widget::sendToFront
            (&(((this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_Group).super_Container.super_Widget);
  peVar1 = (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[3])(peVar1,1);
  peVar1 = (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::locale::locale((locale *)local_60);
  sf::String::String((String *)local_a8,"saveDialog",(locale *)local_60);
  recursive = SUB81(local_a8,0);
  ::gui::ContainerBase::getChild<gui::DialogBox>
            ((ContainerBase *)(local_60 + 0x10),(String *)peVar1,recursive);
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_);
  }
  std::locale::~locale((locale *)local_60);
  uVar3 = local_60._16_8_;
  std::locale::locale((locale *)local_70);
  sf::String::String((String *)local_a8,"saveSubmitButton",(locale *)local_70);
  ::gui::ContainerBase::getChild<gui::Button>((ContainerBase *)local_60,(String *)uVar3,recursive);
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_);
  }
  std::locale::~locale((locale *)local_70);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
           *)&(((pointer)(local_60._0_8_ + 0x250))->
              super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  local_78 = (String *)uVar3;
  local_a8._8_8_ = uVar3;
  local_a8._0_8_ = this;
  std::function<void_()>::function((function<void_()> *)(local_a8 + 0x10),action);
  this_01 = &(((pointer)(local_60._0_8_ + 0x250))->
             super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
  sVar5 = std::
          map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::count((map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                   *)this_01,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
  while (sVar5 != 0) {
    ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
    sVar5 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
            ::count((map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                     *)this_01,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
  }
  p_Var6 = (_Link_type)operator_new(0x50);
  *(int *)(p_Var6->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
  local_40 = this;
  puVar7 = (undefined8 *)operator_new(0x30);
  *puVar7 = local_a8._0_8_;
  puVar7[1] = local_a8._8_8_;
  std::function<void_()>::function
            ((function<void_()> *)(puVar7 + 2),(function<void_()> *)(local_a8 + 0x10));
  *(code **)((p_Var6->_M_storage)._M_storage + 0x20) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:201:39)>
       ::_M_invoke;
  *(undefined8 **)((p_Var6->_M_storage)._M_storage + 8) = puVar7;
  (p_Var6->_M_storage)._M_storage[0x10] = '\0';
  (p_Var6->_M_storage)._M_storage[0x11] = '\0';
  (p_Var6->_M_storage)._M_storage[0x12] = '\0';
  (p_Var6->_M_storage)._M_storage[0x13] = '\0';
  (p_Var6->_M_storage)._M_storage[0x14] = '\0';
  (p_Var6->_M_storage)._M_storage[0x15] = '\0';
  (p_Var6->_M_storage)._M_storage[0x16] = '\0';
  (p_Var6->_M_storage)._M_storage[0x17] = '\0';
  *(code **)((p_Var6->_M_storage)._M_storage + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:201:39)>
       ::_M_manager;
  (p_Var6->_M_storage)._M_storage[0x28] = '\x01';
  (p_Var6->_M_storage)._M_storage[0x29] = '\0';
  (p_Var6->_M_storage)._M_storage[0x2a] = '\0';
  (p_Var6->_M_storage)._M_storage[0x2b] = '\0';
  pVar9 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::_M_get_insert_unique_pos
                    ((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                      *)this_01,(key_type_conflict1 *)&p_Var6->_M_storage);
  if (pVar9.second == (_Base_ptr)0x0) {
    ::gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>::~Callback
              ((Callback<gui::Widget_*,_const_sf::Vector2<float>_&> *)
               ((p_Var6->_M_storage)._M_storage + 8));
    operator_delete(p_Var6);
  }
  else {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_insert_node((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                      *)this_01,pVar9.first,pVar9.second,p_Var6);
  }
  pEVar4 = local_40;
  ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  if (local_88 != (code *)0x0) {
    (*local_88)((_Any_data *)(local_a8 + 0x10),(_Any_data *)(local_a8 + 0x10),__destroy_functor);
  }
  uVar3 = local_60._16_8_;
  std::locale::locale(local_38);
  sf::String::String((String *)local_a8,"saveRefuseButton",local_38);
  pSVar2 = local_78;
  ::gui::ContainerBase::getChild<gui::Button>((ContainerBase *)local_70,(String *)uVar3,recursive);
  if ((EditorInterface *)local_a8._0_8_ != (EditorInterface *)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_);
  }
  std::locale::~locale(local_38);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
           *)(local_70._0_8_ + 600));
  local_a8._0_8_ = pEVar4;
  local_a8._8_8_ = pSVar2;
  std::function<void_()>::function((function<void_()> *)(local_a8 + 0x10),action);
  this_00 = (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
             *)(local_70._0_8_ + 600);
  sVar5 = std::
          map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::count((map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                   *)this_00,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
  while (sVar5 != 0) {
    ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
    sVar5 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
            ::count((map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                     *)this_00,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
  }
  p_Var6 = (_Link_type)operator_new(0x50);
  *(int *)(p_Var6->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
  puVar7 = (undefined8 *)operator_new(0x30);
  *puVar7 = local_a8._0_8_;
  puVar7[1] = local_a8._8_8_;
  std::function<void_()>::function
            ((function<void_()> *)(puVar7 + 2),(function<void_()> *)(local_a8 + 0x10));
  *(code **)((p_Var6->_M_storage)._M_storage + 0x20) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:210:39)>
       ::_M_invoke;
  *(undefined8 **)((p_Var6->_M_storage)._M_storage + 8) = puVar7;
  (p_Var6->_M_storage)._M_storage[0x10] = '\0';
  (p_Var6->_M_storage)._M_storage[0x11] = '\0';
  (p_Var6->_M_storage)._M_storage[0x12] = '\0';
  (p_Var6->_M_storage)._M_storage[0x13] = '\0';
  (p_Var6->_M_storage)._M_storage[0x14] = '\0';
  (p_Var6->_M_storage)._M_storage[0x15] = '\0';
  (p_Var6->_M_storage)._M_storage[0x16] = '\0';
  (p_Var6->_M_storage)._M_storage[0x17] = '\0';
  *(code **)((p_Var6->_M_storage)._M_storage + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:210:39)>
       ::_M_manager;
  (p_Var6->_M_storage)._M_storage[0x28] = '\x01';
  (p_Var6->_M_storage)._M_storage[0x29] = '\0';
  (p_Var6->_M_storage)._M_storage[0x2a] = '\0';
  (p_Var6->_M_storage)._M_storage[0x2b] = '\0';
  pVar9 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::_M_get_insert_unique_pos(this_00,(key_type_conflict1 *)&p_Var6->_M_storage);
  if (pVar9.second == (_Base_ptr)0x0) {
    ::gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>::~Callback
              ((Callback<gui::Widget_*,_const_sf::Vector2<float>_&> *)
               ((p_Var6->_M_storage)._M_storage + 8));
    operator_delete(p_Var6);
  }
  else {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_insert_node(this_00,pVar9.first,pVar9.second,p_Var6);
  }
  ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  if (local_88 != (code *)0x0) {
    (*local_88)((_Any_data *)(local_a8 + 0x10),(_Any_data *)(local_a8 + 0x10),__destroy_functor);
  }
  (**(code **)((((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)local_60._16_8_)->_M_dataplus)._M_p + 6))(local_60._16_8_,1);
  pVVar8 = ::gui::Panel::getSize
                     ((pEVar4->modalBackground_).
                      super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_78 = (String *)CONCAT44(local_78._4_4_,pVVar8->x);
  pVVar8 = ::gui::Panel::getSize
                     ((pEVar4->modalBackground_).
                      super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  x = local_78._0_4_ * 0.5;
  if (80.0 <= x) {
    x = 80.0;
  }
  y = pVVar8->y * 0.5;
  if (80.0 <= y) {
    y = 80.0;
  }
  ::gui::Widget::setPosition((Widget *)(local_60._16_8_ + 0x20),x,y);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

void EditorInterface::showSaveDialog(const std::function<void()>& action) {
    modalBackground_->sendToFront();
    modalBackground_->setVisible(true);
    auto saveDialog = modalBackground_->getChild<gui::DialogBox>("saveDialog");
    auto saveDialogPtr = saveDialog.get();

    auto saveSubmitButton = saveDialog->getChild<gui::Button>("saveSubmitButton");
    saveSubmitButton->onClick.disconnectAll();
    saveSubmitButton->onClick.connect([this,saveDialogPtr,action]() {
        saveDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
        editor_.saveBoard();
        action();    // FIXME: the action runs immediately and doesn't give gui time to update, do we want to run this in a Timer instance instead? Could that cause issues? (someone clears the timers, or we happen to run that in a different thread)
    });

    auto saveRefuseButton = saveDialog->getChild<gui::Button>("saveRefuseButton");
    saveRefuseButton->onClick.disconnectAll();
    saveRefuseButton->onClick.connect([this,saveDialogPtr,action]() {
        saveDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
        action();
    });

    saveDialog->setVisible(true);
    saveDialog->setPosition(
        std::min(80.0f, modalBackground_->getSize().x / 2.0f),
        std::min(80.0f, modalBackground_->getSize().y / 2.0f)
    );
}